

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

uint32_t __thiscall HvFile::allocpath(HvFile *this,HKEY root,uint32_t parent,string *path)

{
  uint uVar1;
  pointer psVar2;
  key *pkVar3;
  roots *prVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  base *pbVar8;
  __shared_ptr<ent::base,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pkVar3 = (key *)operator_new(0x80);
  ent::key::key(pkVar3,(uint32_t)
                       ((ulong)((long)(this->_items).
                                      super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_items).
                                     super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4),path);
  std::__shared_ptr<ent::base,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ent::key,void>
            (local_40,pkVar3);
  std::vector<std::shared_ptr<ent::base>,std::allocator<std::shared_ptr<ent::base>>>::
  emplace_back<std::shared_ptr<ent::base>>
            ((vector<std::shared_ptr<ent::base>,std::allocator<std::shared_ptr<ent::base>>> *)
             &this->_items,(shared_ptr<ent::base> *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  uVar6 = ((this->_items).
           super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_id & 0xfffffff;
  if (parent == 0) {
    psVar2 = (this->_items).
             super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = psVar2[this->_rootid].super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    prVar4 = ent::base::asroots(pbVar8);
    uVar7 = (ulong)root & 0xff;
    uVar1 = (prVar4->_lasts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[uVar7];
    if ((uVar1 & 0xfffffff) == 0) {
      (prVar4->_roots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = uVar6 + 0x20000000;
      pbVar8 = psVar2[this->_rootid].super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    else {
      pkVar3 = ent::base::askey(*(base **)((long)&(psVar2->
                                                  super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + (ulong)(uVar1 << 4)));
      uVar5 = uVar6 + 0x20000000;
      if (uVar6 == 0) {
        uVar5 = 0;
      }
      pkVar3->_nextsibling = uVar5;
    }
    prVar4 = ent::base::asroots(pbVar8);
    (prVar4->_lasts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] = uVar6 + 0x20000000;
  }
  else {
    psVar2 = (this->_items).
             super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = psVar2[parent].super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pkVar3 = ent::base::askey(pbVar8);
    if ((pkVar3->_lastchild & 0xfffffff) == 0) {
      uVar5 = uVar6 + 0x20000000;
      if (uVar6 == 0) {
        uVar5 = uVar6;
      }
      pkVar3->_firstchild = uVar5;
    }
    else {
      pkVar3 = ent::base::askey(*(base **)((long)&(psVar2->
                                                  super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + (ulong)(pkVar3->_lastchild << 4)));
      uVar5 = uVar6 + 0x20000000;
      if (uVar6 == 0) {
        uVar5 = uVar6;
      }
      pkVar3->_nextsibling = uVar5;
    }
    pkVar3 = ent::base::askey(pbVar8);
    pkVar3->_lastchild = uVar5;
  }
  return uVar6;
}

Assistant:

uint32_t allocpath(HKEY root, uint32_t parent, const std::string& path)
    {
        _items.push_back(ent::entry_ptr(new ent::key(_items.size(), path)));
        uint32_t id= _items.back()->id();

        if (parent) {
            uint32_t lkey= _items[parent]->askey()->lastchild();
            if (!lkey)
                _items[parent]->askey()->firstchild(id);
            else
                _items[lkey]->askey()->nextsibling(id);
            _items[parent]->askey()->lastchild(id);
        }
        else {
            uint32_t rkey= _items[_rootid]->asroots()->lasthivekey(root);
            if (!rkey)
                _items[_rootid]->asroots()->hiveid(root, id);
            else 
                _items[rkey]->askey()->nextsibling(id);
            _items[_rootid]->asroots()->lasthivekey(root, id);
        }

        return id;
    }